

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

QAccessibleInterface * __thiscall
QAccessibleToolButton::child(QAccessibleToolButton *this,int index)

{
  QToolButton *pQVar1;
  QMenu *pQVar2;
  QObject *pQVar3;
  QAccessibleInterface *pQVar4;
  
  if (index == 0) {
    pQVar1 = toolButton(this);
    pQVar2 = QToolButton::menu(pQVar1);
    if (pQVar2 != (QMenu *)0x0) {
      pQVar1 = toolButton(this);
      pQVar3 = (QObject *)QToolButton::menu(pQVar1);
      pQVar4 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar3);
      return pQVar4;
    }
  }
  return (QAccessibleInterface *)0x0;
}

Assistant:

QAccessibleInterface *QAccessibleToolButton::child(int index) const
{
#if QT_CONFIG(menu)
    if (index == 0 && toolButton()->menu())
    {
        return QAccessible::queryAccessibleInterface(toolButton()->menu());
    }
#else
    Q_UNUSED(index);
#endif
    return nullptr;
}